

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::LoadEnvironmentPresets(cmake *this)

{
  bool bVar1;
  bool hasEnvironmentGenerator;
  anon_class_16_2_d2341f1b readGeneratorVar;
  string envGenVar;
  bool local_a9;
  anon_class_16_2_d2341f1b local_a8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_a9 = false;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_GENERATOR",&local_38);
  if (bVar1) {
    local_a9 = true;
    std::__cxx11::string::_M_assign((string *)&this->EnvironmentGenerator);
  }
  local_a8.hasEnvironmentGenerator = &local_a9;
  local_a8.this = this;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_GENERATOR_INSTANCE","")
  ;
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            (&local_a8,&local_58,&this->GeneratorInstance);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_GENERATOR_PLATFORM","")
  ;
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            (&local_a8,&local_78,&this->GeneratorPlatform);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_GENERATOR_TOOLSET","");
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            (&local_a8,&local_98,&this->GeneratorToolset);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmake::LoadEnvironmentPresets()
{
  std::string envGenVar;
  bool hasEnvironmentGenerator = false;
  if (cmSystemTools::GetEnv("CMAKE_GENERATOR", envGenVar)) {
    hasEnvironmentGenerator = true;
    this->EnvironmentGenerator = envGenVar;
  }

  auto readGeneratorVar = [&](std::string name, std::string& key) {
    std::string varValue;
    if (cmSystemTools::GetEnv(name, varValue)) {
      if (hasEnvironmentGenerator) {
        key = varValue;
      } else if (!this->GetIsInTryCompile()) {
        std::string message = "Warning: Environment variable ";
        message += name;
        message += " will be ignored, because CMAKE_GENERATOR ";
        message += "is not set.";
        cmSystemTools::Message(message, "Warning");
      }
    }
  };

  readGeneratorVar("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance);
  readGeneratorVar("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform);
  readGeneratorVar("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset);
}